

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

bool __thiscall
deqp::gls::UniformBlockCase::checkLayoutIndices(UniformBlockCase *this,UniformLayout *layout)

{
  ostringstream *poVar1;
  pointer pBVar2;
  ostringstream *poVar3;
  int iVar4;
  TestLog *pTVar5;
  pointer pUVar6;
  pointer pBVar7;
  bool bVar8;
  MessageBuilder *this_00;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int *value;
  int iVar12;
  ulong uVar13;
  long lVar14;
  MessageBuilder local_1b0;
  
  pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  uVar10 = (ulong)((long)(layout->uniforms).
                         super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(layout->uniforms).
                        super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 6;
  uVar13 = (ulong)((long)(layout->blocks).
                         super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(layout->blocks).
                        super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 6;
  poVar3 = &local_1b0.m_str;
  lVar14 = 0;
  iVar9 = (int)uVar10;
  uVar11 = 0;
  if (0 < iVar9) {
    uVar11 = uVar10 & 0xffffffff;
  }
  bVar8 = true;
  for (; iVar12 = (int)uVar13, uVar11 * 0x40 != lVar14; lVar14 = lVar14 + 0x40) {
    pUVar6 = (layout->uniforms).
             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = *(int *)((long)&pUVar6->blockNdx + lVar14);
    if ((iVar4 < 0) || (iVar12 <= iVar4)) {
      local_1b0.m_log = pTVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
      std::operator<<((ostream *)poVar3,"Error: Invalid block index in uniform \'");
      std::operator<<((ostream *)poVar3,(string *)((long)&(pUVar6->name)._M_dataplus._M_p + lVar14))
      ;
      std::operator<<((ostream *)poVar3,"\'");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
      bVar8 = false;
    }
  }
  poVar3 = &local_1b0.m_str;
  uVar11 = 0;
  uVar10 = uVar13 & 0xffffffff;
  if (iVar12 < 1) {
    uVar10 = uVar11;
  }
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pBVar7 = (layout->blocks).
             super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = pBVar7 + uVar11;
    for (value = *(int **)&pBVar7[uVar11].activeUniformIndices.
                           super__Vector_base<int,_std::allocator<int>_>;
        value != *(pointer *)
                  ((long)&(pBVar2->activeUniformIndices).
                          super__Vector_base<int,_std::allocator<int>_> + 8); value = value + 1) {
      if ((*value < 0) || (iVar9 <= *value)) {
        local_1b0.m_log = pTVar5;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
        std::operator<<((ostream *)poVar3,"Error: Invalid active uniform index ");
        this_00 = tcu::MessageBuilder::operator<<(&local_1b0,value);
        poVar1 = &this_00->m_str;
        std::operator<<((ostream *)poVar1," in block \'");
        std::operator<<((ostream *)poVar1,(string *)pBVar2);
        std::operator<<((ostream *)poVar1,"\'");
        tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
        bVar8 = false;
      }
    }
  }
  return bVar8;
}

Assistant:

bool UniformBlockCase::checkLayoutIndices (const UniformLayout& layout) const
{
	TestLog&	log			= m_testCtx.getLog();
	int			numUniforms	= (int)layout.uniforms.size();
	int			numBlocks	= (int)layout.blocks.size();
	bool		isOk		= true;

	// Check uniform block indices.
	for (int uniformNdx = 0; uniformNdx < numUniforms; uniformNdx++)
	{
		const UniformLayoutEntry& uniform = layout.uniforms[uniformNdx];

		if (uniform.blockNdx < 0 || !deInBounds32(uniform.blockNdx, 0, numBlocks))
		{
			log << TestLog::Message << "Error: Invalid block index in uniform '" << uniform.name << "'" << TestLog::EndMessage;
			isOk = false;
		}
	}

	// Check active uniforms.
	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BlockLayoutEntry& block = layout.blocks[blockNdx];

		for (vector<int>::const_iterator uniformIter = block.activeUniformIndices.begin(); uniformIter != block.activeUniformIndices.end(); uniformIter++)
		{
			if (!deInBounds32(*uniformIter, 0, numUniforms))
			{
				log << TestLog::Message << "Error: Invalid active uniform index " << *uniformIter << " in block '" << block.name << "'" << TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}